

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O1

void __thiscall Catch::Session::showHelp(Session *this)

{
  ostream *poVar1;
  char local_1a [2];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nCatch2 v",9);
  libraryVersion();
  operator<<((ostream *)&std::cout,&libraryVersion::version);
  local_1a[0] = '\n';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_1a,1);
  Clara::Parser::writeToStream(&this->m_cli,poVar1);
  local_1a[1] = 10;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1a + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"For more detailed usage please see the project docs\n\n",0x35);
  std::ostream::flush();
  return;
}

Assistant:

void Session::showHelp() const {
        Catch::cout()
                << "\nCatch2 v" << libraryVersion() << '\n'
                << m_cli << '\n'
                << "For more detailed usage please see the project docs\n\n" << std::flush;
    }